

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

double __thiscall
bgui::ImageAdapter<unsigned_short>::getIntensityOfPixel
          (ImageAdapter<unsigned_short> *this,long x,long y)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  long *plVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  long local_28;
  long local_20;
  long local_18 [3];
  
  dVar12 = (this->super_ImageAdapterBase).scale;
  dVar1 = this->vmin;
  local_18[0] = (long)((double)x / dVar12);
  local_18[1] = (long)((double)y / dVar12);
  local_18[2] = 1;
  lVar10 = 0;
  local_20 = 0;
  local_28 = 0;
  plVar7 = &local_20;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    lVar9 = *plVar7;
    lVar11 = 0;
    do {
      lVar9 = lVar9 + local_18[lVar11] * (this->super_ImageAdapterBase).R.v[lVar10][lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    *plVar7 = lVar9;
    lVar10 = 1;
    plVar7 = &local_28;
    bVar4 = false;
  } while (bVar6);
  dVar12 = dVar1 + -1.0;
  iVar2 = this->image->depth;
  iVar3 = (this->super_ImageAdapterBase).channel;
  iVar8 = 0;
  if (-1 < iVar3 && iVar3 < iVar2) {
    iVar8 = iVar3;
  }
  iVar5 = iVar2 + -1;
  if (-1 < iVar3 && iVar3 < iVar2) {
    iVar5 = iVar3;
  }
  if (iVar8 <= iVar5) {
    lVar10 = 0;
    dVar13 = dVar12;
    do {
      dVar12 = (double)this->image->img[iVar8 + lVar10][local_28][local_20];
      if (dVar12 <= dVar13) {
        dVar12 = dVar13;
      }
      lVar10 = lVar10 + 1;
      dVar13 = dVar12;
    } while ((iVar5 - iVar8) + 1 != (int)lVar10);
  }
  if (this->vmax < dVar12 || dVar12 < dVar1) {
    dVar12 = INFINITY;
  }
  return dVar12;
}

Assistant:

double getIntensityOfPixel(long x, long y) const
    {
      double ret=vmin-1;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        if (image->get(p[0], p[1], d) > ret)
        {
          ret=image->get(p[0], p[1], d);
        }
      }

      if (ret < vmin || ret > vmax)
      {
        ret=std::numeric_limits<double>::infinity();
      }

      return ret;
    }